

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::DumpRegStats(FunctionBody *this,FunctionBody *funcBody)

{
  uint local_20;
  uint local_1c;
  uint stores;
  uint loads;
  FunctionBody *funcBody_local;
  FunctionBody *this_local;
  
  if (funcBody->callCountStats != 0) {
    local_1c = funcBody->regAllocLoadCount;
    local_20 = funcBody->regAllocStoreCount;
    if ((DAT_01eafde9 & 1) != 0) {
      local_1c = local_1c / this->callCountStats;
      local_20 = local_20 / this->callCountStats;
    }
    DumpFullFunctionName(funcBody);
    Output::SkipToColumn(0x37);
    Output::Print(L"Calls:%6d  Loads:%9d  Stores:%9d  Total refs:%9d\n",(ulong)this->callCountStats,
                  (ulong)local_1c,(ulong)local_20,(ulong)(local_1c + local_20));
  }
  return;
}

Assistant:

void FunctionBody::DumpRegStats(FunctionBody *funcBody)
    {
        if (funcBody->callCountStats == 0)
        {
            return;
        }
        uint loads = funcBody->regAllocLoadCount;
        uint stores = funcBody->regAllocStoreCount;

        if (Js::Configuration::Global.flags.NormalizeStats)
        {
            loads /= this->callCountStats;
            stores /= this->callCountStats;
        }
        funcBody->DumpFullFunctionName();
        Output::SkipToColumn(55);
        Output::Print(_u("Calls:%6d  Loads:%9d  Stores:%9d  Total refs:%9d\n"), this->callCountStats,
            loads, stores, loads + stores);
    }